

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

char __thiscall
duckdb::QuantileSortTree::WindowScalar<signed_char,signed_char,true>
          (QuantileSortTree *this,QuantileCursor<signed_char> *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  char cVar1;
  pointer pWVar2;
  unsigned_long lidx;
  unsigned_long hidx;
  Interpolator<true> interp;
  ID indirect;
  Interpolator<true> local_60;
  QuantileIndirect<signed_char> local_38;
  
  unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
  operator->(&this->index_tree);
  duckdb::WindowMergeSortTree::Build();
  local_60.desc = false;
  local_60.FRN = Interpolator<true>::Index(q,n);
  local_60.begin = 0;
  local_60.CRN = local_60.FRN;
  local_60.end = n;
  pWVar2 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>::
           operator->(&this->index_tree);
  lidx = duckdb::WindowIndexTree::SelectNth(pWVar2,(ulong)frames);
  hidx = lidx;
  if (local_60.CRN != local_60.FRN) {
    pWVar2 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
             ::operator->(&this->index_tree);
    hidx = duckdb::WindowIndexTree::SelectNth(pWVar2,(ulong)frames);
  }
  local_38.data = data;
  cVar1 = Interpolator<true>::
          Interpolate<unsigned_long,signed_char,duckdb::QuantileIndirect<signed_char>>
                    (&local_60,lidx,hidx,result,&local_38);
  return cVar1;
}

Assistant:

RESULT_TYPE WindowScalar(QuantileCursor<INPUT_TYPE> &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) {
		D_ASSERT(n > 0);

		//	Thread safe and idempotent.
		index_tree->Build();

		//	Find the interpolated indicies within the frame
		Interpolator<DISCRETE> interp(q, n, false);
		const auto lo_data = SelectNth(frames, interp.FRN);
		auto hi_data = lo_data;
		if (interp.CRN != interp.FRN) {
			hi_data = SelectNth(frames, interp.CRN);
		}

		//	Interpolate indirectly
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);
		return interp.template Interpolate<idx_t, RESULT_TYPE, ID>(lo_data, hi_data, result, indirect);
	}